

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int n;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      auVar1 = vmaxss_avx(ZEXT416((uint)(items->Width - width_excess)),ZEXT416(0x3f800000));
      items->Width = auVar1._0_4_;
    }
  }
  else {
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    uVar2 = 1;
    for (; ((int)uVar2 < count && (0.0 < width_excess));
        width_excess = width_excess - auVar1._0_4_ * fVar6) {
      for (uVar2 = (ulong)(int)uVar2; (long)uVar2 < (long)count; uVar2 = uVar2 + 1) {
        fVar5 = items->Width;
        fVar6 = items[uVar2].Width;
        if (fVar6 < fVar5) {
          if (fVar6 < 0.0) goto LAB_0015e7d8;
          fVar5 = fVar5 - fVar6;
          goto LAB_0015e7e2;
        }
      }
      fVar5 = items->Width;
LAB_0015e7d8:
      fVar5 = fVar5 + -1.0;
LAB_0015e7e2:
      if (fVar5 <= 0.0) break;
      fVar6 = (float)(int)uVar2;
      auVar1 = vminss_avx(ZEXT416((uint)(width_excess / fVar6)),ZEXT416((uint)fVar5));
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = uVar2 & 0xffffffff;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        items[uVar4].Width = items[uVar4].Width - auVar1._0_4_;
      }
    }
    uVar3 = 0;
    uVar2 = (ulong)(uint)count;
    if (count < 1) {
      uVar2 = uVar3;
    }
    fVar5 = 0.0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)items[uVar3].Width));
      fVar5 = fVar5 + (items[uVar3].Width - auVar1._0_4_);
      items[uVar3].Width = auVar1._0_4_;
    }
    if (0.0 < fVar5) {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        if (items[uVar3].Index < (int)(fVar5 + 0.01)) {
          items[uVar3].Width = items[uVar3].Width + 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}